

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

cupdlp_int cupdlp_infNormIndex(CUPDLPwork *w,cupdlp_int n,cupdlp_float *x,cupdlp_int *res)

{
  cupdlp_int cVar1;
  
  cVar1 = nrminfindex(n,x,(cupdlp_int)x);
  *res = cVar1;
  return 0;
}

Assistant:

cupdlp_int cupdlp_infNormIndex(CUPDLPwork *w, const cupdlp_int n,
                               const cupdlp_float *x, cupdlp_int *res) {
#ifndef CUPDLP_CPU
#ifndef SFLOAT
  CHECK_CUBLAS(cublasIdamax(w->cublashandle, n, x, 1, res));
#else
  CHECK_CUBLAS(cublasIsamax(w->cublashandle, n, x, 1, res));
#endif
#else
  *res = nrminfindex(n, x, 1);
#endif
  return 0;
}